

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acecFadds.c
# Opt level: O3

Vec_Wec_t * Gia_ManCollectTopmost(Gia_Man_t *p,Vec_Int_t *vFadds,Vec_Int_t *vMap,int nFaddMin)

{
  uint *puVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  Vec_Int_t *vChain;
  int *piVar6;
  Vec_Wec_t *pVVar7;
  void *__s;
  ulong uVar8;
  uint uVar9;
  uint uVar10;
  size_t __size;
  uint uVar11;
  Vec_Int_t *__s_00;
  int iVar12;
  uint uVar13;
  Vec_Int_t *local_88;
  
  vChain = (Vec_Int_t *)malloc(0x10);
  vChain->nCap = 100;
  vChain->nSize = 0;
  piVar6 = (int *)malloc(400);
  vChain->pArray = piVar6;
  iVar2 = vFadds->nSize;
  iVar3 = iVar2 >> 0x1f;
  iVar12 = iVar2 / 5 + iVar3;
  uVar9 = iVar12 - iVar3;
  pVVar7 = (Vec_Wec_t *)malloc(0x10);
  uVar5 = 8;
  if (6 < (iVar12 - iVar3) - 1U) {
    uVar5 = uVar9;
  }
  pVVar7->nSize = 0;
  pVVar7->nCap = uVar5;
  if (uVar5 == 0) {
    local_88 = (Vec_Int_t *)0x0;
  }
  else {
    local_88 = (Vec_Int_t *)calloc((long)(int)uVar5,0x10);
  }
  pVVar7->pArray = local_88;
  iVar12 = (((int)uVar9 >> 5) + 1) - (uint)((uVar9 & 0x1f) == 0);
  if (iVar12 == 0) {
    __size = 0;
    __s = (void *)0x0;
  }
  else {
    __size = (long)iVar12 << 2;
    __s = malloc(__size);
  }
  uVar13 = iVar12 * 0x20;
  memset(__s,0,__size);
  if (4 < iVar2) {
    uVar8 = 0;
    do {
      if ((ulong)(long)iVar2 <= uVar8) {
LAB_005e167b:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                      ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      iVar3 = vFadds->pArray[uVar8];
      if (((long)iVar3 < 0) || (vMap->nSize <= iVar3)) goto LAB_005e167b;
      uVar10 = vMap->pArray[iVar3];
      if (-1 < (int)uVar10) {
        if ((int)uVar13 <= (int)uVar10) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecBit.h"
                        ,0x132,"void Vec_BitWriteEntry(Vec_Bit_t *, int, int)");
        }
        puVar1 = (uint *)((long)__s + (ulong)(uVar10 >> 5) * 4);
        *puVar1 = *puVar1 | 1 << ((byte)uVar10 & 0x1f);
      }
      uVar8 = uVar8 + 5;
    } while ((ulong)uVar9 * 5 != uVar8);
  }
  Gia_ManIncrementTravId(p);
  if (4 < vFadds->nSize) {
    uVar9 = 0;
    if (iVar12 * 0x20 < 1) {
      uVar13 = 0;
    }
    uVar10 = 0;
    do {
      if (uVar10 == uVar13) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecBit.h"
                      ,0x121,"int Vec_BitEntry(Vec_Bit_t *, int)");
      }
      if ((*(uint *)((long)__s + (ulong)(uVar10 >> 5) * 4) >> (uVar10 & 0x1f) & 1) == 0) {
        Gia_ManCollectOneChain(p,vFadds,uVar10,vMap,vChain);
        uVar4 = vChain->nSize;
        if (nFaddMin <= (int)uVar4) {
          if (uVar9 == uVar5) {
            if ((int)uVar5 < 0x10) {
              if (local_88 == (Vec_Int_t *)0x0) {
                local_88 = (Vec_Int_t *)malloc(0x100);
              }
              else {
                local_88 = (Vec_Int_t *)realloc(local_88,0x100);
              }
              pVVar7->pArray = local_88;
              __s_00 = local_88 + (int)uVar5;
              uVar11 = 0x10;
              uVar5 = 0x10 - uVar5;
            }
            else {
              uVar11 = uVar5 * 2;
              if (local_88 == (Vec_Int_t *)0x0) {
                local_88 = (Vec_Int_t *)malloc((ulong)uVar11 << 4);
              }
              else {
                local_88 = (Vec_Int_t *)realloc(local_88,(ulong)uVar11 << 4);
              }
              pVVar7->pArray = local_88;
              __s_00 = local_88 + uVar5;
            }
            memset(__s_00,0,(ulong)uVar5 << 4);
            pVVar7->nCap = uVar11;
            uVar5 = uVar11;
          }
          uVar11 = uVar9 + 1;
          pVVar7->nSize = uVar11;
          if ((int)uVar9 < 0) {
            __assert_fail("p->nSize > 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecWec.h"
                          ,0x9f,"Vec_Int_t *Vec_WecEntryLast(Vec_Wec_t *)");
          }
          uVar9 = uVar11;
          if (0 < (int)uVar4) {
            piVar6 = vChain->pArray;
            uVar8 = 0;
            do {
              Vec_IntPush(local_88 + ((ulong)uVar11 - 1),piVar6[uVar8]);
              uVar8 = uVar8 + 1;
            } while (uVar4 != uVar8);
            if (0 < (int)uVar4) {
              piVar6 = vChain->pArray;
              uVar8 = 0;
              do {
                iVar2 = piVar6[uVar8];
                if (iVar2 < 0) goto LAB_005e167b;
                uVar11 = iVar2 * 5 + 3;
                if (vFadds->nSize <= (int)uVar11) goto LAB_005e167b;
                iVar12 = vFadds->pArray[uVar11];
                if (p->nTravIdsAlloc <= iVar12) {
LAB_005e169a:
                  __assert_fail("Id < p->nTravIdsAlloc",
                                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                                ,0x23f,"int Gia_ObjIsTravIdCurrentId(Gia_Man_t *, int)");
                }
                if (p->pTravIds[iVar12] == p->nTravIds) {
                  __assert_fail("!Gia_ObjIsTravIdCurrentId(p, Vec_IntEntry(vFadds, 5*iFadd+3))",
                                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/acec/acecFadds.c"
                                ,0x20b,
                                "Vec_Wec_t *Gia_ManCollectTopmost(Gia_Man_t *, Vec_Int_t *, Vec_Int_t *, int)"
                               );
                }
                uVar11 = iVar2 * 5 + 4;
                if ((uint)vFadds->nSize <= uVar11) goto LAB_005e167b;
                iVar2 = vFadds->pArray[uVar11];
                if (p->nTravIdsAlloc <= iVar2) goto LAB_005e169a;
                if (p->pTravIds[iVar2] == p->nTravIds) {
                  __assert_fail("!Gia_ObjIsTravIdCurrentId(p, Vec_IntEntry(vFadds, 5*iFadd+4))",
                                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/acec/acecFadds.c"
                                ,0x20c,
                                "Vec_Wec_t *Gia_ManCollectTopmost(Gia_Man_t *, Vec_Int_t *, Vec_Int_t *, int)"
                               );
                }
                Gia_ManMarkWithTravId_rec(p,iVar12);
                if (vFadds->nSize <= (int)uVar11) goto LAB_005e167b;
                Gia_ManMarkWithTravId_rec(p,vFadds->pArray[uVar11]);
                uVar8 = uVar8 + 1;
              } while (uVar4 != uVar8);
            }
          }
        }
      }
      uVar10 = uVar10 + 1;
    } while ((int)uVar10 < vFadds->nSize / 5);
  }
  if (__s != (void *)0x0) {
    free(__s);
  }
  if (vChain->pArray != (int *)0x0) {
    free(vChain->pArray);
  }
  free(vChain);
  return pVVar7;
}

Assistant:

Vec_Wec_t * Gia_ManCollectTopmost( Gia_Man_t * p, Vec_Int_t * vFadds, Vec_Int_t * vMap, int nFaddMin )
{
    int i, j, iFadd;
    Vec_Int_t * vChain  = Vec_IntAlloc( 100 );
    Vec_Wec_t * vChains = Vec_WecAlloc( Vec_IntSize(vFadds)/5 );
    // erase elements appearing as FADD inputs
    Vec_Bit_t * vMarksTop = Vec_BitStart( Vec_IntSize(vFadds)/5 );
    Dtc_ForEachFadd( vFadds, i )
        if ( (iFadd = Vec_IntEntry(vMap, Vec_IntEntry(vFadds, 5*i+0))) >= 0 )
            Vec_BitWriteEntry( vMarksTop, iFadd, 1 );
    // compress the remaining ones
    Gia_ManIncrementTravId( p );
    Dtc_ForEachFadd( vFadds, i )
    {
        if ( Vec_BitEntry(vMarksTop, i) )
            continue;
        Gia_ManCollectOneChain( p, vFadds, i, vMap, vChain );
        if ( Vec_IntSize(vChain) < nFaddMin )
            continue;
        Vec_IntAppend( Vec_WecPushLevel(vChains), vChain );
        Vec_IntForEachEntry( vChain, iFadd, j )
        {
            assert( !Gia_ObjIsTravIdCurrentId(p, Vec_IntEntry(vFadds, 5*iFadd+3)) );
            assert( !Gia_ObjIsTravIdCurrentId(p, Vec_IntEntry(vFadds, 5*iFadd+4)) );
            Gia_ManMarkWithTravId_rec( p, Vec_IntEntry(vFadds, 5*iFadd+3) );
            Gia_ManMarkWithTravId_rec( p, Vec_IntEntry(vFadds, 5*iFadd+4) );
        }
    }
    // cleanup
    Vec_BitFree( vMarksTop );
    Vec_IntFree( vChain );
    return vChains;
}